

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void obx::internal::throwError(obx_err err,string *message)

{
  runtime_error *this;
  DbException *this_00;
  MaxDataSizeExceededException *this_01;
  pointer_____offset_0x10___ *ppuVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  switch(err) {
  case 0x2711:
    this_01 = (MaxDataSizeExceededException *)__cxa_allocate_exception(0x10);
    IllegalStateException::runtime_error((IllegalStateException *)this_01,message);
    ppuVar1 = &IllegalStateException::typeinfo;
    break;
  case 0x2712:
    this_01 = (MaxDataSizeExceededException *)__cxa_allocate_exception(0x10);
    IllegalArgumentException::runtime_error((IllegalArgumentException *)this_01,message);
    ppuVar1 = &IllegalArgumentException::typeinfo;
    break;
  case 0x2713:
  case 0x2714:
switchD_00105f9d_caseD_2713:
    this_00 = (DbException *)__cxa_allocate_exception(0x18);
    DbException::DbException(this_00,message,err);
    __cxa_throw(this_00,&DbException::typeinfo,std::runtime_error::~runtime_error);
  case 0x2715:
    this_01 = (MaxDataSizeExceededException *)__cxa_allocate_exception(0x10);
    FeatureNotAvailableException::runtime_error((FeatureNotAvailableException *)this_01,message);
    ppuVar1 = &FeatureNotAvailableException::typeinfo;
    break;
  case 0x2716:
    this_01 = (MaxDataSizeExceededException *)__cxa_allocate_exception(0x10);
    ShuttingDownException::runtime_error((ShuttingDownException *)this_01,message);
    ppuVar1 = &ShuttingDownException::typeinfo;
    break;
  default:
    if (err != 0x2778) {
      if (err == 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_40,"No error occurred; operation was successful. Given message: ",
                       message);
        std::runtime_error::runtime_error(this,(string *)&local_40);
        *(undefined ***)this = &PTR__runtime_error_00112b18;
        __cxa_throw(this,&IllegalStateException::typeinfo,std::runtime_error::~runtime_error);
      }
      goto switchD_00105f9d_caseD_2713;
    }
    this_01 = (MaxDataSizeExceededException *)__cxa_allocate_exception(0x10);
    MaxDataSizeExceededException::runtime_error(this_01,message);
    ppuVar1 = &MaxDataSizeExceededException::typeinfo;
  }
  __cxa_throw(this_01,ppuVar1,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void throwError(obx_err err, const std::string& message) {
    if (err == OBX_SUCCESS) {  // Zero, there's no error actually: this is atypical corner case, which should be avoided
        throw IllegalStateException("No error occurred; operation was successful. Given message: " + message);
    } else {
        if (err == OBX_ERROR_ILLEGAL_ARGUMENT) {
            throw IllegalArgumentException(message);
        } else if (err == OBX_ERROR_ILLEGAL_STATE) {
            throw IllegalStateException(message);
        } else if (err == OBX_ERROR_SHUTTING_DOWN) {
            throw ShuttingDownException(message);
        } else if (err == OBX_ERROR_MAX_DATA_SIZE_EXCEEDED) {
            throw MaxDataSizeExceededException(message);
        } else if (err == OBX_ERROR_FEATURE_NOT_AVAILABLE) {
            throw FeatureNotAvailableException(message);
        } else {
            throw DbException(message, err);
        }
    }
}